

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

CharPtr __thiscall
fmt::BasicWriter<char>::
prepare_int_buffer<fmt::IntFormatSpec<unsigned_long,fmt::TypeSpec<(char)0>,char>>
          (BasicWriter<char> *this,uint num_digits,
          IntFormatSpec<unsigned_long,_fmt::TypeSpec<__x00_>,_char> *spec,char *prefix,
          uint prefix_size)

{
  char cVar1;
  uint uVar2;
  Alignment prefix_size_00;
  int iVar3;
  int value;
  Type_conflict TVar4;
  uint uVar5;
  uint uVar6;
  CharPtr pcVar7;
  char *__last;
  char *__first;
  AlignSpec *in_RCX;
  TypeSpec<__x00_> *in_RDX;
  int in_ESI;
  Buffer<char> *in_RDI;
  int in_R8D;
  CharPtr end;
  CharPtr p;
  CharPtr p_3;
  uint size;
  CharPtr p_2;
  CharPtr result;
  CharPtr p_1;
  uint fill_size;
  AlignSpec subspec;
  uint number_size;
  char fill;
  Alignment align;
  uint width;
  undefined4 in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff78;
  BasicWriter<char> *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  wchar_t fill_00;
  undefined4 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  CharPtr in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffe8;
  CharPtr local_8;
  
  uVar5 = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  fill_00 = (wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  uVar2 = TypeSpec<'\x00'>::width(in_RDX);
  prefix_size_00 = TypeSpec<'\x00'>::align(in_RDX);
  cVar1 = TypeSpec<'\x00'>::fill(in_RDX);
  internal::BasicCharTraits<char>::cast((int)cVar1);
  iVar3 = TypeSpec<'\x00'>::precision(in_RDX);
  if (in_ESI < iVar3) {
    if ((in_R8D != 0) &&
       (*(char *)((long)&(in_RCX->super_WidthSpec).width_ + (ulong)(in_R8D - 1)) == '0')) {
      in_R8D = in_R8D + -1;
    }
    iVar3 = in_R8D;
    value = TypeSpec<'\x00'>::precision(in_RDX);
    uVar6 = (uint)((ulong)in_RDX >> 0x20);
    TVar4 = internal::to_unsigned<int>(value);
    uVar5 = in_R8D + TVar4;
    AlignSpec::AlignSpec
              ((AlignSpec *)in_stack_ffffffffffffff80,
               (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20),(wchar_t)in_stack_ffffffffffffff78,
               (Alignment)((ulong)in_RDI >> 0x20));
    if (uVar5 < uVar2) {
      Buffer<char>::reserve(in_RDI,CONCAT44(in_R8D,in_stack_ffffffffffffff68));
      if (prefix_size_00 != ALIGN_LEFT) {
        grow_buffer(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
        std::uninitialized_fill<char*,char>
                  ((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(char *)in_RDI);
      }
      local_8 = prepare_int_buffer<fmt::AlignSpec>
                          ((BasicWriter<char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),uVar6,
                           in_RCX,(char *)CONCAT44(iVar3,uVar2),prefix_size_00);
      if (prefix_size_00 == ALIGN_LEFT) {
        grow_buffer(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
        std::uninitialized_fill<char*,char>
                  ((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(char *)in_RDI);
      }
    }
    else {
      local_8 = prepare_int_buffer<fmt::AlignSpec>
                          ((BasicWriter<char> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),uVar6,
                           in_RCX,(char *)CONCAT44(iVar3,uVar2),prefix_size_00);
    }
  }
  else {
    uVar6 = in_R8D + in_ESI;
    if (uVar6 < uVar2) {
      pcVar7 = grow_buffer(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
      __last = pcVar7 + uVar2;
      if (prefix_size_00 == ALIGN_LEFT) {
        std::uninitialized_copy<char_const*,char*>(pcVar7,__last,(char *)in_RDI);
        __first = pcVar7 + uVar6;
        std::uninitialized_fill<char*,char>(__first,__last,(char *)in_RDI);
        __last = __first;
      }
      else if (prefix_size_00 == ALIGN_CENTER) {
        pcVar7 = fill_padding(in_stack_ffffffffffffffa0,uVar5,
                              CONCAT44(uVar6,in_stack_ffffffffffffff90),fill_00);
        std::uninitialized_copy<char_const*,char*>(pcVar7,__last,(char *)in_RDI);
        __last = pcVar7 + uVar6;
      }
      else {
        if (prefix_size_00 == ALIGN_NUMERIC) {
          if (in_R8D != 0) {
            pcVar7 = std::uninitialized_copy<char_const*,char*>(pcVar7,__last,(char *)in_RDI);
          }
        }
        else {
          std::uninitialized_copy<char_const*,char*>(pcVar7,__last,(char *)in_RDI);
        }
        std::uninitialized_fill<char*,char>(pcVar7,__last,(char *)in_RDI);
      }
      local_8 = __last + -1;
    }
    else {
      local_8 = grow_buffer(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
      std::uninitialized_copy<char_const*,char*>
                ((char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(char *)in_RDI);
      local_8 = local_8 + ((ulong)uVar6 - 1);
    }
  }
  return local_8;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}